

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

Result * __thiscall
testing::internal::
FunctionMocker<ot::commissioner::Error_(std::function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::Invoke(Result *__return_storage_ptr__,
        FunctionMocker<ot::commissioner::Error_(std::function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        *this,function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>
              *args,unsigned_long args_1,
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  UntypedActionResultHolderBase *pUVar2;
  _Manager_type p_Var3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  UntypedActionResultHolderBase *pUVar7;
  long lVar8;
  bool bVar9;
  ArgumentTuple tuple;
  GTestLog local_4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  unsigned_long local_40;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_28 = (_Manager_type)0x0;
  local_20 = args->_M_invoker;
  p_Var3 = (args->super__Function_base)._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(args->super__Function_base)._M_functor;
    local_38._8_8_ = *(undefined8 *)((long)&(args->super__Function_base)._M_functor + 8);
    (args->super__Function_base)._M_manager = (_Manager_type)0x0;
    args->_M_invoker = (_Invoker_type)0x0;
    local_28 = p_Var3;
  }
  local_48 = args_2;
  local_40 = args_1;
  pUVar7 = UntypedFunctionMockerBase::UntypedInvokeWith
                     (&this->super_UntypedFunctionMockerBase,&local_48);
  if (pUVar7 == (UntypedActionResultHolderBase *)0x0) {
    bVar9 = true;
  }
  else {
    lVar8 = __dynamic_cast(pUVar7,&UntypedActionResultHolderBase::typeinfo,
                           &ActionResultHolder<ot::commissioner::Error>::typeinfo,0);
    bVar9 = lVar8 != 0;
  }
  bVar9 = IsTrue(bVar9);
  if (!bVar9) {
    GTestLog::GTestLog(&local_4c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/googletest/repo/googletest/include/gtest/internal/gtest-port.h"
                       ,0x44d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Condition f == nullptr || dynamic_cast<To>(f) != nullptr failed. ",0x41);
    GTestLog::~GTestLog(&local_4c);
  }
  __return_storage_ptr__->mCode = *(ErrorCode *)&pUVar7[1]._vptr_UntypedActionResultHolderBase;
  paVar1 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)paVar1;
  pUVar2 = pUVar7 + 4;
  if ((UntypedActionResultHolderBase *)pUVar7[2]._vptr_UntypedActionResultHolderBase == pUVar2) {
    uVar4 = *(undefined4 *)((long)&pUVar7[4]._vptr_UntypedActionResultHolderBase + 4);
    uVar5 = *(undefined4 *)&pUVar7[5]._vptr_UntypedActionResultHolderBase;
    uVar6 = *(undefined4 *)((long)&pUVar7[5]._vptr_UntypedActionResultHolderBase + 4);
    *(undefined4 *)paVar1 = *(undefined4 *)&pUVar2->_vptr_UntypedActionResultHolderBase;
    *(undefined4 *)((long)&(__return_storage_ptr__->mMessage).field_2 + 4) = uVar4;
    *(undefined4 *)((long)&(__return_storage_ptr__->mMessage).field_2 + 8) = uVar5;
    *(undefined4 *)((long)&(__return_storage_ptr__->mMessage).field_2 + 0xc) = uVar6;
  }
  else {
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)pUVar7[2]._vptr_UntypedActionResultHolderBase;
    (__return_storage_ptr__->mMessage).field_2._M_allocated_capacity =
         (size_type)pUVar2->_vptr_UntypedActionResultHolderBase;
  }
  (__return_storage_ptr__->mMessage)._M_string_length =
       (size_type)pUVar7[3]._vptr_UntypedActionResultHolderBase;
  pUVar7[2]._vptr_UntypedActionResultHolderBase = (_func_int **)pUVar2;
  pUVar7[3]._vptr_UntypedActionResultHolderBase = (_func_int **)0x0;
  *(undefined1 *)&pUVar7[4]._vptr_UntypedActionResultHolderBase = 0;
  if (pUVar7 != (UntypedActionResultHolderBase *)0x0) {
    (*pUVar7->_vptr_UntypedActionResultHolderBase[1])(pUVar7);
  }
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }